

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O3

void quiver_absorb_num(player *p,object *obj,int *n_add_pack,int *n_to_quiver)

{
  ushort uVar1;
  object *obj_00;
  int iVar2;
  byte bVar3;
  _Bool _Var4;
  _Bool _Var5;
  wchar_t wVar6;
  wchar_t wVar7;
  int iVar8;
  uint uVar9;
  angband_constants *paVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  int local_64;
  
  _Var4 = tval_is_ammo(obj);
  if (((_Var4) || (_Var5 = flag_has_dbg(obj->flags,6,0x29,"obj->flags","OF_THROWING"), _Var5)) &&
     (wVar6 = preferred_quiver_slot(obj), z_info->quiver_size != 0)) {
    uVar16 = 0;
    iVar15 = 0;
    iVar12 = 0;
    local_64 = 0;
    bVar3 = 0;
    paVar10 = z_info;
    do {
      obj_00 = p->upkeep->quiver[uVar16];
      if (obj_00 == (object *)0x0) {
        local_64 = local_64 + 1;
        if ((uint)wVar6 == uVar16 || _Var4) {
          uVar1 = paVar10->quiver_slot_size;
          goto LAB_00195229;
        }
      }
      else {
        _Var5 = tval_is_ammo(obj_00);
        uVar13 = 1;
        if (!_Var5) {
          uVar13 = (uint)z_info->thrown_quiver_mult;
        }
        iVar15 = iVar15 + obj_00->number * uVar13;
        _Var5 = object_stackable(obj_00,obj,OSTACK_PACK);
        paVar10 = z_info;
        if (_Var5) {
          uVar13 = uVar13 * obj_00->number;
          uVar1 = z_info->quiver_slot_size;
          if (uVar1 < uVar13) {
            __assert_fail("quiver_obj->number * mult <= z_info->quiver_slot_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                          ,0x29e,
                          "void quiver_absorb_num(const struct player *, const struct object *, int *, int *)"
                         );
          }
          iVar12 = iVar12 - uVar13;
LAB_00195229:
          iVar12 = iVar12 + (uint)uVar1;
        }
        else if (((uint)wVar6 == uVar16) &&
                (wVar7 = preferred_quiver_slot(obj_00), paVar10 = z_info, wVar7 != wVar6)) {
          uVar13 = uVar13 * obj_00->number;
          if (z_info->quiver_slot_size < uVar13) {
            __assert_fail("quiver_obj->number * mult <= z_info->quiver_slot_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                          ,0x2ac,
                          "void quiver_absorb_num(const struct player *, const struct object *, int *, int *)"
                         );
          }
          if (_Var4) {
            iVar12 = iVar12 - uVar13;
          }
          iVar12 = iVar12 + (uint)z_info->quiver_slot_size;
          bVar3 = 1;
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < paVar10->quiver_size);
    if ((iVar12 != 0) && ((bool)(~bVar3 & 1) || (bool)(local_64 != 0 & bVar3))) {
      uVar13 = 1;
      if (!_Var4) {
        uVar13 = (uint)paVar10->thrown_quiver_mult;
      }
      uVar1 = paVar10->quiver_slot_size;
      uVar11 = iVar15 % (int)(uint)uVar1;
      iVar15 = uVar1 - uVar11;
      if (uVar11 == 0) {
        iVar15 = 0;
      }
      uVar14 = (uint)uVar1;
      iVar8 = 0;
      if (0 < *n_add_pack) {
        iVar8 = *n_add_pack * uVar14;
      }
      iVar2 = iVar8 + iVar15;
      if (iVar12 < iVar8 + iVar15) {
        iVar2 = iVar12;
      }
      uVar9 = iVar2 / (int)uVar13;
      if ((int)(uint)obj->number <= (int)uVar9) {
        uVar9 = (uint)obj->number;
      }
      *n_to_quiver = uVar9;
      *n_add_pack = *n_add_pack - (int)(uVar9 * uVar13 + ~uVar11 + uVar14) / (int)uVar14;
      return;
    }
  }
  *n_to_quiver = 0;
  return;
}

Assistant:

static void quiver_absorb_num(const struct player *p, const struct object *obj,
		int *n_add_pack, int *n_to_quiver)
{
	bool ammo = tval_is_ammo(obj);

	/* Must be ammo or good for throwing */
	if (ammo || of_has(obj->flags, OF_THROWING)) {
		int i, quiver_count = 0, space_free = 0, n_empty = 0;
		int desired_slot = preferred_quiver_slot(obj);
		bool displaces = false;

		/* Count the current space this object could go into. */
		for (i = 0; i < z_info->quiver_size; i++) {
			const struct object *quiver_obj = p->upkeep->quiver[i];
			if (quiver_obj) {
				int mult = tval_is_ammo(quiver_obj) ?
					1 : z_info->thrown_quiver_mult;

				quiver_count += quiver_obj->number * mult;
				if (object_stackable(quiver_obj, obj, OSTACK_PACK)) {
					assert(quiver_obj->number * mult <=
						z_info->quiver_slot_size);
					space_free += z_info->quiver_slot_size -
						quiver_obj->number * mult;
				} else if (desired_slot == i &&
						preferred_quiver_slot(quiver_obj) != i) {
					/*
					 * The object to be added prefers to go
					 * in this slot, but it's occupied by
					 * something that could be displaced
					 * to another quiver slot, if one is
					 * available.
					 */
					displaces = true;
					assert(quiver_obj->number * mult <=
						z_info->quiver_slot_size);
					/*
					 * Avoid double counting in the ammo
					 * case since the empty slot, if any,
					 * for the displaced stack is treated
					 * as fully available.
					 */
					if (ammo) {
						space_free += z_info->quiver_slot_size
							- quiver_obj->number
							* mult;
					} else {
						space_free += z_info->quiver_slot_size;
					}
				}
			} else {
				++n_empty;
				/*
				 * Ammo can fit in any empty slot in the quiver.
				 * Non-ammo throwing items are restricted to
				 * their preferred slot.
				 */
				if (ammo || desired_slot == i) {
					space_free += z_info->quiver_slot_size;
				}
			}
		}

		/*
		 * Only possible to add if there is space free in the quiver
		 * and either are displacing a pile with an empty quiver slot
		 * available for it or are not displacing a pile at all.
		 */
		if (space_free && ((displaces && n_empty) || !displaces)) {
			int mult = ammo ? 1 : z_info->thrown_quiver_mult;
			/*
			 * When quiver_count % quiver_slot_size is zero, adding
			 * anything will require a pack slot.
			 */
			int remainder = quiver_count % z_info->quiver_slot_size;
			int limit_from_pack = (remainder) ?
				z_info->quiver_slot_size - remainder : 0;

			if (*n_add_pack > 0) {
				limit_from_pack += *n_add_pack *
					z_info->quiver_slot_size;
			}

			/* Return the number or amount that fits. */
			space_free = MIN(space_free, limit_from_pack);
			*n_to_quiver = MIN(obj->number, space_free / mult);
			*n_add_pack -= (*n_to_quiver * mult +
				z_info->quiver_slot_size - 1 -
				remainder) / z_info->quiver_slot_size;
			return;
		}
	}

	/* Not suitable for the quiver or no space */
	*n_to_quiver = 0;
}